

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

bool __thiscall despot::util::tinyxml::TiXmlPrinter::Visit(TiXmlPrinter *this,TiXmlText *text)

{
  TiXmlString *this_00;
  TiXmlString str;
  TiXmlString local_20;
  
  if (text->cdata == true) {
    DoIndent(this);
    this_00 = &this->buffer;
    TiXmlString::operator+=(this_00,"<![CDATA[");
    TiXmlString::operator+=(this_00,((text->super_TiXmlNode).value.rep_)->str);
    TiXmlString::operator+=(this_00,"]]>");
    DoLineBreak(this);
  }
  else {
    if (this->simpleTextPrint == true) {
      local_20.rep_ = (Rep *)TiXmlString::nullrep_;
      TiXmlBase::EncodeString(&(text->super_TiXmlNode).value,&local_20);
      TiXmlString::operator+=(&this->buffer,&local_20);
    }
    else {
      DoIndent(this);
      local_20.rep_ = (Rep *)TiXmlString::nullrep_;
      TiXmlBase::EncodeString(&(text->super_TiXmlNode).value,&local_20);
      TiXmlString::operator+=(&this->buffer,&local_20);
      DoLineBreak(this);
    }
    TiXmlString::quit(&local_20);
  }
  return true;
}

Assistant:

bool TiXmlPrinter::Visit(const TiXmlText& text) {
	if (text.CDATA()) {
		DoIndent();
		buffer += "<![CDATA[";
		buffer += text.Value();
		buffer += "]]>";
		DoLineBreak();
	} else if (simpleTextPrint) {
		TIXML_STRING str;
		TiXmlBase::EncodeString(text.ValueTStr(), &str);
		buffer += str;
	} else {
		DoIndent();
		TIXML_STRING str;
		TiXmlBase::EncodeString(text.ValueTStr(), &str);
		buffer += str;
		DoLineBreak();
	}
	return true;
}